

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkleblock.cpp
# Opt level: O0

uint256 * __thiscall
CPartialMerkleTree::CalcHash
          (CPartialMerkleTree *this,int height,uint pos,
          vector<uint256,_std::allocator<uint256>_> *vTxid)

{
  long lVar1;
  uint height_00;
  uint uVar2;
  size_type sVar3;
  const_reference pvVar4;
  int in_ECX;
  int in_EDX;
  vector<uint256,_std::allocator<uint256>_> *in_RSI;
  CPartialMerkleTree *in_RDI;
  undefined8 in_R8;
  long in_FS_OFFSET;
  uint256 right;
  uint256 left;
  uint256 *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  CPartialMerkleTree *this_00;
  uint256 *in_stack_ffffffffffffffa0;
  uint256 *in_stack_ffffffffffffffa8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  sVar3 = std::vector<uint256,_std::allocator<uint256>_>::size
                    ((vector<uint256,_std::allocator<uint256>_> *)in_stack_ffffffffffffff58);
  if (sVar3 == 0) {
    __assert_fail("vTxid.size() != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/merkleblock.cpp"
                  ,0x3d,
                  "uint256 CPartialMerkleTree::CalcHash(int, unsigned int, const std::vector<uint256> &)"
                 );
  }
  if (in_EDX == 0) {
    pvVar4 = std::vector<uint256,_std::allocator<uint256>_>::operator[]
                       ((vector<uint256,_std::allocator<uint256>_> *)this_00,
                        CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    *(undefined8 *)this_00 = *(undefined8 *)(pvVar4->super_base_blob<256U>).m_data._M_elems;
    (this_00->vBits).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_p =
         *(_Bit_type **)((pvVar4->super_base_blob<256U>).m_data._M_elems + 8);
    *(undefined8 *)
     &(this_00->vBits).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_offset =
         *(undefined8 *)((pvVar4->super_base_blob<256U>).m_data._M_elems + 0x10);
    (this_00->vBits).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._M_p =
         *(_Bit_type **)((pvVar4->super_base_blob<256U>).m_data._M_elems + 0x18);
  }
  else {
    CalcHash((CPartialMerkleTree *)CONCAT44(in_EDX,in_ECX),(int)((ulong)in_R8 >> 0x20),(uint)in_R8,
             in_RSI);
    uint256::uint256(in_stack_ffffffffffffff58);
    height_00 = in_ECX * 2 + 1;
    uVar2 = CalcTreeWidth(this_00,height_00);
    if (height_00 < uVar2) {
      CalcHash((CPartialMerkleTree *)CONCAT44(in_EDX,in_ECX),(int)((ulong)in_R8 >> 0x20),(uint)in_R8
               ,in_RSI);
    }
    Hash<uint256,uint256>(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (uint256 *)in_RDI;
}

Assistant:

uint256 CPartialMerkleTree::CalcHash(int height, unsigned int pos, const std::vector<uint256> &vTxid) {
    //we can never have zero txs in a merkle block, we always need the coinbase tx
    //if we do not have this assert, we can hit a memory access violation when indexing into vTxid
    assert(vTxid.size() != 0);
    if (height == 0) {
        // hash at height 0 is the txids themselves
        return vTxid[pos];
    } else {
        // calculate left hash
        uint256 left = CalcHash(height-1, pos*2, vTxid), right;
        // calculate right hash if not beyond the end of the array - copy left hash otherwise
        if (pos*2+1 < CalcTreeWidth(height-1))
            right = CalcHash(height-1, pos*2+1, vTxid);
        else
            right = left;
        // combine subhashes
        return Hash(left, right);
    }
}